

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

Pubkey * cfd::core::SchnorrUtil::ComputeSigPoint
                   (Pubkey *__return_storage_ptr__,ByteData256 *msg,SchnorrPubkey *nonce,
                   SchnorrPubkey *pubkey)

{
  int iVar1;
  undefined8 uVar2;
  CfdException *this;
  allocator local_111;
  string local_110;
  secp256k1_pubkey_conflict secp_sigpoint;
  secp256k1_xonly_pubkey secp_nonce;
  secp256k1_xonly_pubkey xonly_pubkey;
  
  uVar2 = wally_get_secp_context();
  ParseXOnlyPubkey(&xonly_pubkey,pubkey);
  ParseXOnlyPubkey(&secp_nonce,nonce);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110,msg);
  iVar1 = secp256k1_schnorrsig_compute_sigpoint
                    (uVar2,&secp_sigpoint,local_110._M_dataplus._M_p,&secp_nonce,&xonly_pubkey);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110);
  if (iVar1 == 1) {
    ConvertSecpPubkey(__return_storage_ptr__,&secp_sigpoint);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_110,"Could not compute sigpoint",&local_111);
  CfdException::CfdException(this,kCfdInternalError,&local_110);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey SchnorrUtil::ComputeSigPoint(
    const ByteData256 &msg, const SchnorrPubkey &nonce,
    const SchnorrPubkey &pubkey) {
  auto ctx = wally_get_secp_context();
  secp256k1_xonly_pubkey xonly_pubkey = ParseXOnlyPubkey(pubkey);

  secp256k1_xonly_pubkey secp_nonce = ParseXOnlyPubkey(nonce);

  secp256k1_pubkey secp_sigpoint;

  auto ret = secp256k1_schnorrsig_compute_sigpoint(
      ctx, &secp_sigpoint, msg.GetBytes().data(), &secp_nonce, &xonly_pubkey);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not compute sigpoint");
  }

  return ConvertSecpPubkey(secp_sigpoint);
}